

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O3

void __thiscall
yactfr::internal::PseudoNamedDt::PseudoNamedDt
          (PseudoNamedDt *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,Up *pseudoDt,Up *attrs)

{
  undefined8 *puVar1;
  type tVar2;
  _Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_> _Var3;
  type tVar4;
  undefined8 uVar5;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_20;
  
  _Var3.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (_Head_base<0UL,_const_yactfr::MapItem_*,_false>)
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  (this->super_WithAttrsMixin)._attrs._M_t.
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false> =
       _Var3.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_20);
  (this->_name).super_type.m_initialized = false;
  if ((name->super_type).m_initialized == true) {
    puVar1 = (undefined8 *)((long)&(this->_name).super_type.m_storage.dummy_ + 0x10);
    *(undefined8 **)&(this->_name).super_type.m_storage.dummy_ = puVar1;
    tVar4 = (name->super_type).m_storage.dummy_.aligner_;
    tVar2 = (type)((long)&(name->super_type).m_storage.dummy_ + 0x10);
    if (tVar4 == tVar2) {
      uVar5 = *(undefined8 *)((long)&(name->super_type).m_storage.dummy_ + 0x18);
      *puVar1 = *(undefined8 *)tVar2;
      *(undefined8 *)((long)&(this->_name).super_type.m_storage.dummy_ + 0x18) = uVar5;
    }
    else {
      (this->_name).super_type.m_storage.dummy_.aligner_ = tVar4;
      *(undefined8 *)((long)&(this->_name).super_type.m_storage.dummy_ + 0x10) =
           *(undefined8 *)tVar2;
    }
    *(undefined8 *)((long)&(this->_name).super_type.m_storage.dummy_ + 8) =
         *(undefined8 *)((long)&(name->super_type).m_storage.dummy_ + 8);
    *(type *)&(name->super_type).m_storage.dummy_ = tVar2;
    *(undefined8 *)((long)&(name->super_type).m_storage.dummy_ + 8) = 0;
    (name->super_type).m_storage.dummy_.data[0x10] = '\0';
    (this->_name).super_type.m_initialized = true;
  }
  (this->_pseudoDt)._M_t.
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl =
       (pseudoDt->_M_t).
       super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
       ._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
       .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  (pseudoDt->_M_t).
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl = (PseudoDt *)0x0;
  return;
}

Assistant:

PseudoNamedDt::PseudoNamedDt(boost::optional<std::string> name, PseudoDt::Up pseudoDt,
                             MapItem::Up attrs) :
    WithAttrsMixin {std::move(attrs)},
    _name {std::move(name)},
    _pseudoDt {std::move(pseudoDt)}
{
}